

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBucket.cpp
# Opt level: O2

char * __thiscall
Memory::LargeHeapBucket::PageHeapAlloc
          (LargeHeapBucket *this,Recycler *recycler,size_t sizeCat,size_t size,
          ObjectInfoBits attributes,PageHeapMode mode,bool nothrow)

{
  size_t *psVar1;
  PageHeapMode PVar2;
  Boolean BVar3;
  code *pcVar4;
  bool bVar5;
  uint uVar6;
  BOOL BVar7;
  HeapAllocator *pHVar8;
  Segment *pSVar9;
  undefined4 *puVar10;
  char *pcVar11;
  LargeHeapBlock *this_00;
  Recycler *pRVar12;
  IdleDecommitPageAllocator *pIVar13;
  uint uVar14;
  PageHeapData *pPVar15;
  char *address;
  undefined6 in_register_00000082;
  char *lpAddress;
  LargeHeapBucket *pLVar16;
  undefined **local_c8;
  size_t actualPageCount;
  size_t local_b8;
  char *local_b0;
  DWORD local_a8;
  undefined1 local_a0 [8];
  anon_class_16_2_a17ce691 throwOrReturn;
  DWORD oldProtect;
  Segment *local_80;
  Segment *segment;
  long local_70;
  uint local_64;
  PageHeapData *local_60;
  IdleDecommitPageAllocator *local_58;
  Recycler *local_50;
  Recycler *recycler_local;
  LargeHeapBucket *local_40;
  bool local_31 [8];
  bool nothrow_local;
  
  throwOrReturn.nothrow = (bool *)&local_50;
  local_a0 = (undefined1  [8])local_31;
  local_31[0] = nothrow;
  local_50 = recycler;
  pHVar8 = HeapAllocator::GetNoMemProtectInstance();
  local_c8 = &PageHeapData::typeinfo;
  actualPageCount = 0;
  local_b8 = 0xffffffffffffffff;
  local_b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
  ;
  local_a8 = 0x7a;
  pHVar8 = HeapAllocator::TrackAllocInfo(pHVar8,(TrackAllocData *)&stack0xffffffffffffff38);
  local_60 = (PageHeapData *)HeapAllocator::NoThrowAllocZero(pHVar8,0x48);
  local_60->isLockedWithPageHeap = false;
  local_60->isGuardPageDecommitted = false;
  local_60->pageHeapMode = PageHeapModeOff;
  local_60->field_0x3 = 0;
  local_60->actualPageCount = 0;
  local_60->paddingBytes = 0;
  local_60->unusedBytes = 0;
  *(undefined4 *)&local_60->field_0xc = 0;
  local_60->guardPageAddress = (char *)0x0;
  local_60->objectAddress = (char *)0x0;
  local_60->pageHeapFreeStack = (StackBackTrace *)0x0;
  local_60->objectEndAddr = (char *)0x0;
  local_60->objectPageAddr = (char *)0x0;
  local_60->lastMarkedBy = (char *)0x0;
  local_60->pageHeapAllocStack = (StackBackTrace *)0x0;
  uVar6 = (uint)CONCAT62(in_register_00000082,attributes);
  local_64 = uVar6 | 0x20;
  if (7 < size) {
    local_64 = uVar6;
  }
  if (local_50->verifyEnabled == false) {
    sizeCat = size;
  }
  recycler_local = (Recycler *)sizeCat;
  pSVar9 = (Segment *)LargeHeapBlock::GetPagesNeeded(sizeCat,false);
  local_40 = this;
  if (pSVar9 == (Segment *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar10 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                       ,0x8f,"(pageCount != 0)","pageCount != 0");
    if (!bVar5) goto LAB_00662ec3;
    *puVar10 = 0;
  }
  pLVar16 = local_40;
  local_c8 = (undefined **)((long)&(pSVar9->super_SegmentBaseCommon).allocator + 1);
  local_58 = HeapInfo::GetRecyclerLargeBlockPageAllocator((local_40->super_HeapBucket).heapInfo);
  pcVar11 = PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
            ::Alloc(&local_58->super_PageAllocator,(size_t *)&stack0xffffffffffffff38,&local_80);
  pPVar15 = local_60;
  if (((ulong)pcVar11 & 0xfff) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar10 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                       ,0x94,"((size_t)baseAddress%AutoSystemInfo::PageSize == 0)",
                       "(size_t)baseAddress%AutoSystemInfo::PageSize == 0");
    if (!bVar5) goto LAB_00662ec3;
    *puVar10 = 0;
  }
  if (pcVar11 == (char *)0x0) {
    pHVar8 = HeapAllocator::GetNoMemProtectInstance();
LAB_00662d36:
    DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,Memory::PageHeapData>
              (pHVar8,pPVar15);
  }
  else {
    local_70 = (long)local_c8 - (long)pSVar9;
    PVar2 = ((pLVar16->super_HeapBucket).heapInfo)->pageHeapMode;
    pPVar15->pageHeapMode = PVar2;
    segment = pSVar9;
    if (PVar2 == PageHeapModeBlockEnd) {
      uVar6 = -(int)recycler_local & 0xf;
      pPVar15->unusedBytes = (ushort)uVar6;
      uVar14 = -(uVar6 + (int)recycler_local) - 0x20;
      uVar6 = uVar14 & 0xfff;
      pPVar15->paddingBytes = (ushort)uVar6;
      if ((uVar14 & 0xf) != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar10 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                           ,0xae,
                           "(pageHeapData->paddingBytes%HeapConstants::ObjectGranularity == 0)",
                           "pageHeapData->paddingBytes%HeapConstants::ObjectGranularity == 0");
        if (!bVar5) goto LAB_00662ec3;
        *puVar10 = 0;
        uVar6 = (uint)pPVar15->paddingBytes;
      }
      address = pcVar11 + uVar6;
      lpAddress = pcVar11 + (long)pSVar9 * 0x1000;
      pPVar15->objectPageAddr = pcVar11;
    }
    else if (PVar2 == PageHeapModeBlockStart) {
      pPVar15->paddingBytes = 0;
      address = pcVar11 + local_70 * 0x1000;
      pPVar15->unusedBytes = 0xfe0U - (short)recycler_local & 0xfff;
      pPVar15->objectPageAddr = address;
      lpAddress = pcVar11;
    }
    else {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar10 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                         ,0xb7,"(false)","false");
      if (!bVar5) goto LAB_00662ec3;
      *puVar10 = 0;
      address = (char *)0x0;
      lpAddress = (char *)0x0;
    }
    pLVar16 = local_40;
    pSVar9 = segment;
    this_00 = LargeHeapBlock::New(address,(size_t)segment,local_80,1,local_40);
    pIVar13 = local_58;
    pPVar15 = local_60;
    if (this_00 == (LargeHeapBlock *)0x0) {
      PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
      ::SuspendIdleDecommit(&local_58->super_PageAllocator);
      PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
      ::Release(&pIVar13->super_PageAllocator,pcVar11,(size_t)local_c8,local_80);
      PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
      ::ResumeIdleDecommit(&pIVar13->super_PageAllocator);
      pHVar8 = HeapAllocator::GetNoMemProtectInstance();
      pPVar15 = local_60;
      goto LAB_00662d36;
    }
    if (local_60->pageHeapMode == PageHeapModeBlockStart) {
      pSVar9 = (Segment *)local_c8;
    }
    this_00->addressEnd = pcVar11 + (long)pSVar9 * 0x1000;
    local_60->actualPageCount = (uint)local_c8;
    local_60->guardPageAddress = lpAddress;
    this_00->heapInfo = (pLVar16->super_HeapBucket).heapInfo;
    this_00->pageHeapData = local_60;
    pRVar12 = HeapBucket::GetRecycler(&pLVar16->super_HeapBucket);
    BVar3 = pRVar12->recyclerFlagsTable->PageHeapDecommitGuardPage;
    pIVar13 = HeapBlock::GetPageAllocator
                        (&this_00->super_HeapBlock,(pLVar16->super_HeapBucket).heapInfo);
    if (BVar3 == false && (pIVar13->super_PageAllocator).disablePageReuse == false) {
      BVar7 = VirtualProtect(lpAddress,local_70 << 0xc,1,(PDWORD)((long)&throwOrReturn.recycler + 4)
                            );
      if (BVar7 == 0) goto LAB_00662ec5;
      pPVar15->isGuardPageDecommitted = false;
    }
    else {
      BVar7 = VirtualFree(lpAddress,local_70 << 0xc,0x4000);
      if (BVar7 == 0) {
LAB_00662ec5:
        Js::Throw::FatalInternalError(-0x7fffbffb);
      }
      pPVar15->isGuardPageDecommitted = true;
    }
    pLVar16 = local_40;
    pRVar12 = recycler_local;
    pcVar11 = LargeHeapBlock::Alloc(this_00,(size_t)recycler_local,(ObjectInfoBits)local_64);
    pPVar15->objectAddress = pcVar11;
    if (pcVar11 == (char *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar10 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                         ,0xf6,"(pageHeapData->objectAddress != nullptr)",
                         "pageHeapData->objectAddress != nullptr");
      if (!bVar5) {
LAB_00662ec3:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar10 = 0;
      pcVar11 = pPVar15->objectAddress;
      pLVar16 = local_40;
      if (pcVar11 != (char *)0x0) goto LAB_00662de9;
    }
    else {
LAB_00662de9:
      pPVar15->objectEndAddr = pcVar11 + (long)pRVar12;
      memset(pPVar15->objectPageAddr,0xf0,(ulong)pPVar15->paddingBytes);
      memset(pPVar15->objectAddress + (long)&pRVar12->Cookie,0xf0,(ulong)pPVar15->unusedBytes);
      pSVar9 = segment;
      bVar5 = HeapBlockMap64::SetHeapBlock
                        (&local_50->heapBlockMap,address,(size_t)segment,&this_00->super_HeapBlock,
                         LargeBlockType,'\0');
      if (bVar5) {
        this_00->next = pLVar16->largePageHeapBlockList;
        pLVar16->largePageHeapBlockList = this_00;
        psVar1 = &(local_50->autoHeap).uncollectedNewPageCount;
        *psVar1 = (long)&(pSVar9->super_SegmentBaseCommon).allocator + *psVar1;
        psVar1 = ((pLVar16->super_HeapBucket).heapInfo)->heapBlockCount + 0xb;
        *psVar1 = *psVar1 + 1;
        if (local_50->capturePageHeapAllocStack == true) {
          LargeHeapBlock::CapturePageHeapAllocStack(this_00);
        }
        pcVar11 = pPVar15->objectAddress;
        goto LAB_00662e9f;
      }
    }
    pIVar13 = local_58;
    PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
    ::SuspendIdleDecommit(&local_58->super_PageAllocator);
    LargeHeapBlock::ReleasePages(this_00,local_50);
    PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
    ::ResumeIdleDecommit(&pIVar13->super_PageAllocator);
    LargeHeapBlock::Delete(this_00);
  }
  pcVar11 = (char *)0x0;
LAB_00662e9f:
  PageHeapAlloc::anon_class_16_2_a17ce691::operator()((anon_class_16_2_a17ce691 *)local_a0,pcVar11);
  return pcVar11;
}

Assistant:

char*
LargeHeapBucket::PageHeapAlloc(Recycler * recycler, size_t sizeCat, size_t size, ObjectInfoBits attributes, PageHeapMode mode, bool nothrow)
{
    auto throwOrReturn = [&](char* memBlock) ->char*
    {
        if (memBlock==nullptr && !nothrow)
        {
            recycler->OutOfMemory();
        }
        return memBlock;
    };

    PageHeapData* pageHeapData = NoMemProtectHeapNewNoThrowZ(PageHeapData);
    if (pageHeapData == nullptr)
    {
        return throwOrReturn(nullptr);
    }


    if (size < sizeof(void*))
    {
        attributes = (ObjectInfoBits)(attributes | LeafBit);
    }

#ifdef RECYCLER_MEMORY_VERIFY
    if (recycler->VerifyEnabled())
    {
        // with recycler verify enabled, it uses the unaligned bytes
        size = sizeCat;
    }
#endif

    size_t pageCount = LargeHeapBlock::GetPagesNeeded(size, false);
    Assert(pageCount != 0);
    size_t actualPageCount = pageCount + 1; // 1 for guard page
    auto pageAllocator = heapInfo->GetRecyclerLargeBlockPageAllocator();
    Segment * segment;
    char * baseAddress = pageAllocator->Alloc(&actualPageCount, &segment);
    Assert((size_t)baseAddress%AutoSystemInfo::PageSize == 0);
    if (baseAddress == nullptr)
    {
        NoMemProtectHeapDelete(pageHeapData);
        return throwOrReturn(nullptr);
    }

    size_t guardPageCount = actualPageCount - pageCount; // pageAllocator can return more than asked pages
    char* headerAddress = nullptr;
    char* guardPageAddress = nullptr;
    size_t sizeWithHeader = size + sizeof(LargeObjectHeader);
    pageHeapData->pageHeapMode = heapInfo->pageHeapMode;
    if (pageHeapData->pageHeapMode == PageHeapMode::PageHeapModeBlockStart)
    {
        headerAddress = baseAddress + AutoSystemInfo::PageSize * guardPageCount;
        guardPageAddress = baseAddress;

        pageHeapData->paddingBytes = 0;
        pageHeapData->unusedBytes = (AutoSystemInfo::PageSize - (sizeWithHeader%AutoSystemInfo::PageSize)) % AutoSystemInfo::PageSize;

        pageHeapData->objectPageAddr = headerAddress;
    }
    else if (pageHeapData->pageHeapMode == PageHeapMode::PageHeapModeBlockEnd)
    {
        pageHeapData->unusedBytes = (HeapConstants::ObjectGranularity - (sizeWithHeader%HeapConstants::ObjectGranularity)) % HeapConstants::ObjectGranularity;
        pageHeapData->paddingBytes = (ushort)((AutoSystemInfo::PageSize - pageHeapData->unusedBytes - sizeWithHeader%AutoSystemInfo::PageSize) % AutoSystemInfo::PageSize);
        Assert(pageHeapData->paddingBytes%HeapConstants::ObjectGranularity == 0);

        headerAddress = baseAddress + pageHeapData->paddingBytes;
        guardPageAddress = baseAddress + pageCount * AutoSystemInfo::PageSize;

        pageHeapData->objectPageAddr = baseAddress;
    }
    else
    {
        AnalysisAssert(false);
    }

    LargeHeapBlock * heapBlock = LargeHeapBlock::New(headerAddress, pageCount, segment, 1, this);
    if (!heapBlock)
    {
        pageAllocator->SuspendIdleDecommit();
        pageAllocator->Release(baseAddress, actualPageCount, segment);
        pageAllocator->ResumeIdleDecommit();
        NoMemProtectHeapDelete(pageHeapData);
        return throwOrReturn(nullptr);
    }


    // adjust the addressEnd
    if (pageHeapData->pageHeapMode == PageHeapMode::PageHeapModeBlockStart)
    {
        heapBlock->addressEnd = baseAddress + AutoSystemInfo::PageSize * actualPageCount;
    }
    else
    {
        heapBlock->addressEnd = baseAddress + AutoSystemInfo::PageSize * pageCount;
    }

    pageHeapData->actualPageCount = (uint)actualPageCount;
    pageHeapData->guardPageAddress = guardPageAddress;

    heapBlock->heapInfo = this->heapInfo;
    heapBlock->pageHeapData = pageHeapData;
    
    bool decommitGuardPage = true;
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
    decommitGuardPage = this->GetRecycler()->GetRecyclerFlagsTable().PageHeapDecommitGuardPage;
#if defined(RECYCLER_NO_PAGE_REUSE)
    decommitGuardPage |= heapBlock->GetPageAllocator(heapInfo)->IsPageReuseDisabled();
#endif
#endif
    if (decommitGuardPage)
    {
#pragma prefast(suppress:6250, "Calling 'VirtualFree' without the MEM_RELEASE flag might free memory but not address descriptors (VADs).")
        if (VirtualFree(guardPageAddress, AutoSystemInfo::PageSize * guardPageCount, MEM_DECOMMIT))
        {
            pageHeapData->isGuardPageDecommitted = true;
        }
        else
        {
            Js::Throw::FatalInternalError();
        }
    }
    else
    {
        DWORD oldProtect;
        if (VirtualProtect(guardPageAddress, AutoSystemInfo::PageSize * guardPageCount, PAGE_NOACCESS, &oldProtect))
        {
            pageHeapData->isGuardPageDecommitted = false;
        }
        else
        {
            Js::Throw::FatalInternalError();
        }        
    }

    pageHeapData->objectAddress = heapBlock->Alloc(size, attributes);
    Assert(pageHeapData->objectAddress != nullptr);
    if (!pageHeapData->objectAddress)
    {
        pageAllocator->SuspendIdleDecommit();
        heapBlock->ReleasePages(recycler);
        pageAllocator->ResumeIdleDecommit();
        LargeHeapBlock::Delete(heapBlock);
        return throwOrReturn(nullptr);
    }

    pageHeapData->objectEndAddr = pageHeapData->objectAddress + size;

    // fill pattern before set pageHeapMode, so background scan stack may verify the pattern
    memset(pageHeapData->objectPageAddr, PageHeapMemFill, pageHeapData->paddingBytes);
    memset(pageHeapData->objectAddress + size, PageHeapMemFill, pageHeapData->unusedBytes);

    if (!recycler->heapBlockMap.SetHeapBlock(headerAddress, pageCount, heapBlock, HeapBlock::HeapBlockType::LargeBlockType, 0))
    {
        pageAllocator->SuspendIdleDecommit();
        heapBlock->ReleasePages(recycler);
        pageAllocator->ResumeIdleDecommit();
        LargeHeapBlock::Delete(heapBlock);
        return throwOrReturn(nullptr);
    }

    heapBlock->SetNextBlock(this->largePageHeapBlockList);
    this->largePageHeapBlockList = heapBlock;

#if ENABLE_PARTIAL_GC
    recycler->autoHeap.uncollectedNewPageCount += pageCount;
#endif

    RECYCLER_SLOW_CHECK(this->heapInfo->heapBlockCount[HeapBlock::HeapBlockType::LargeBlockType]++);
    RECYCLER_PERF_COUNTER_ADD(FreeObjectSize, heapBlock->GetPageCount() * AutoSystemInfo::PageSize);

#ifdef STACK_BACK_TRACE
    if (recycler->ShouldCapturePageHeapAllocStack())
    {
        heapBlock->CapturePageHeapAllocStack();
    }
#endif

    return throwOrReturn(pageHeapData->objectAddress);
}